

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

int input(WINDOW *win,char *str,int len,bool cont)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = -1;
  iVar5 = -1;
  if (win != (WINDOW *)0x0) {
    iVar5 = win->_maxy + 1;
    iVar6 = win->_maxx + 1;
  }
  uVar4 = 0;
  do {
    iVar1 = wgetch(win);
    iVar3 = (int)uVar4;
    if (iVar1 == 0x157) {
LAB_0010249e:
      if (0 < iVar3) {
        return iVar3;
      }
    }
    else if (iVar1 == 0x107) {
      if (0 < iVar3) {
        uVar4 = (ulong)(iVar3 - 1);
        str[uVar4] = '\0';
        std::mutex::lock(&mutwin);
        iVar1 = -1;
        iVar3 = -1;
        if (win != (WINDOW *)0x0) {
          iVar3 = (int)win->_cury;
          iVar1 = (int)win->_curx;
          if (iVar1 < 1) {
            if (win->_cury < 1) goto LAB_0010250e;
            iVar3 = iVar3 + -1;
            iVar1 = ncolums;
          }
          iVar1 = iVar1 + -1;
          iVar2 = wmove(win,iVar3,iVar1);
          if (iVar2 != -1) {
            waddch(win,0x20);
          }
        }
LAB_0010250e:
        wmove(win,iVar3,iVar1);
        pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
      }
    }
    else {
      if (iVar1 == 10) goto LAB_0010249e;
      if ((((0xb < iVar1 - 0x109U) && (3 < iVar1 - 0x102U)) && (iVar1 != 9)) &&
         ((iVar1 != 0x1b && (iVar3 < len)))) {
        uVar4 = (ulong)(iVar3 + 1);
        str[iVar3] = (char)iVar1;
        waddch(win,iVar1);
      }
    }
    std::mutex::lock(&mutwin);
    iVar1 = -1;
    iVar3 = -1;
    if (win != (WINDOW *)0x0) {
      iVar3 = (int)win->_cury;
      iVar1 = (int)win->_curx;
    }
    if ((iVar3 == iVar5) && (iVar1 == iVar6)) {
      iVar5 = iVar5 + 1;
      wresize(win,iVar5,iVar6);
    }
    if (cont) {
      wattr_on(win,0x6600,0);
      mvwprintw(win,0,ncolums + -10,"%d/%d",uVar4,len);
      wattr_off(win,0x6600,0);
    }
    wmove(win,iVar3,iVar1);
    wrefresh(win);
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
  } while( true );
}

Assistant:

int  input(WINDOW *win, char *str, int len, bool cont) {
  int ymax, xmax;
  getmaxyx(win, ymax, xmax);
  int i = 0;
  while(1) {
    int c = wgetch(win);
    if(c == KEY_ENTER || c == 10) {
      if (i > 0)
        break;
    }
    else if (c == KEY_BACKSPACE) {
      if (i > 0) {
        str[--i] = '\0';
        int y, x;
        mutwin.lock();
        getyx(win, y, x);
        if (x > 0) {
          mvwaddch(win, y, --x, ' ');
        }
        else if (y > 0) {
          y--;
          x = ncolums;
          mvwaddch(win, y, --x, ' ');
        }
        wmove(win, y, x);
        mutwin.unlock();
      }
    }
    else if (!((265 <= c && 276 >=c) || (258 <= c && 261 >= c ) || (c == 27) || c == 9)) {
      if (i < len) {
        str[i++] = c;
        waddch(win, c);
      }
    }
    int x, y;

    mutwin.lock();
    getyx(win, y, x);
    if(y == ymax && x == xmax) {
      wresize(win, ++ymax, xmax);
    }
    if (cont) {
      wattron(win, COLOR_PAIR(102));
      mvwprintw(win, 0, ncolums - 10, "%d/%d", i, len);
      wattroff(win, COLOR_PAIR(102));
    }
    wmove(win, y,x);
    wrefresh(win);
    mutwin.unlock();
  }
  return (i);
}